

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

int InstructionSet::x86::max_displayed_operands(Operation operation)

{
  int iVar1;
  
  iVar1 = 2;
  if (operation < BOUND) {
    iVar1 = *(int *)(&DAT_004a6228 + (ulong)operation * 4);
  }
  return iVar1;
}

Assistant:

int InstructionSet::x86::max_displayed_operands(Operation operation) {
	switch(operation) {
		default:	return 2;

		case Operation::INC:	case Operation::DEC:
		case Operation::POP:	case Operation::PUSH:
		case Operation::MUL:	case Operation::IMUL_1:
		case Operation::IDIV:	case Operation::DIV:
		case Operation::ESC:
		case Operation::AAM:	case Operation::AAD:
		case Operation::INT:
		case Operation::JMPabs:	case Operation::JMPfar:
		case Operation::CALLabs:	case Operation::CALLfar:
		case Operation::NEG:	case Operation::NOT:
		case Operation::RETnear:
		case Operation::RETfar:
			return 1;

		// Pedantically, these have an displacement rather than an operand.
		case Operation::JO:		case Operation::JNO:
		case Operation::JB:		case Operation::JNB:
		case Operation::JZ:		case Operation::JNZ:
		case Operation::JBE:	case Operation::JNBE:
		case Operation::JS:		case Operation::JNS:
		case Operation::JP:		case Operation::JNP:
		case Operation::JL:		case Operation::JNL:
		case Operation::JLE:	case Operation::JNLE:
		case Operation::LOOPNE:		case Operation::LOOPE:
		case Operation::LOOP:		case Operation::JCXZ:
		case Operation::CALLrel:	case Operation::JMPrel:
		// Genuine zero-operand instructions:
		case Operation::CMPS:	case Operation::LODS:
		case Operation::MOVS:	case Operation::SCAS:
		case Operation::STOS:
		case Operation::CLC:	case Operation::CLD:
		case Operation::CLI:
		case Operation::STC:	case Operation::STD:
		case Operation::STI:
		case Operation::CMC:
		case Operation::LAHF:	case Operation::SAHF:
		case Operation::AAA:	case Operation::AAS:
		case Operation::DAA:	case Operation::DAS:
		case Operation::CBW:	case Operation::CWD:
		case Operation::INTO:
		case Operation::PUSHF:	case Operation::POPF:
		case Operation::IRET:
		case Operation::NOP:
		case Operation::XLAT:
		case Operation::SALC:
		case Operation::Invalid:
			return 0;
	}
}